

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.h
# Opt level: O2

void __thiscall xLearn::LibsvmParser::~LibsvmParser(LibsvmParser *this)

{
  Parser::~Parser(&this->super_Parser);
  operator_delete(this);
  return;
}

Assistant:

~LibsvmParser() {  }